

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O2

void arangodb::velocypack::Collection::forEach(Slice slice,Predicate *predicate)

{
  bool bVar1;
  unsigned_long __args_1;
  ArrayIterator it;
  Slice local_48;
  ArrayIterator local_40;
  
  ArrayIterator::ArrayIterator(&local_40,slice);
  __args_1 = 0;
  while( true ) {
    if (local_40._position == local_40._size) {
      return;
    }
    local_48 = ArrayIterator::value(&local_40);
    bVar1 = std::function<bool_(const_arangodb::velocypack::Slice_&,_unsigned_long)>::operator()
                      (predicate,&local_48,__args_1);
    if (!bVar1) break;
    ArrayIterator::next(&local_40);
    __args_1 = __args_1 + 1;
  }
  return;
}

Assistant:

void Collection::forEach(Slice slice, Predicate const& predicate) {
  ArrayIterator it(slice);
  ValueLength index = 0;

  while (it.valid()) {
    if (!predicate(it.value(), index)) {
      // abort
      return;
    }
    it.next();
    ++index;
  }
}